

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::log_internal::anon_unknown_0::StderrLogSink::Send
          (StderrLogSink *this,LogEntry *entry)

{
  LogSeverity LVar1;
  bool bVar2;
  LogSeverityAtLeast LVar3;
  anon_class_1_0_00000001 *extraout_RDX;
  anon_class_1_0_00000001 *extraout_RDX_00;
  anon_class_1_0_00000001 *fn;
  SchedulingMode scheduling_mode;
  pointer pcVar5;
  size_type sVar6;
  string_view message;
  LogEntry *pLVar4;
  
  LVar1 = entry->severity_;
  pLVar4 = entry;
  LVar3 = StderrThreshold();
  scheduling_mode = (SchedulingMode)pLVar4;
  fn = extraout_RDX;
  if ((int)LVar1 < (int)LVar3) {
    bVar2 = IsInitialized();
    fn = extraout_RDX_00;
    if (bVar2) {
      return;
    }
  }
  if ((__atomic_base<unsigned_int>)
      Send::warn_if_not_initialized.control_.super___atomic_base<unsigned_int>._M_i !=
      (__atomic_base<unsigned_int>)0xdd) {
    base_internal::
    CallOnceImpl<absl::lts_20250127::log_internal::(anonymous_namespace)::StderrLogSink::Send(absl::lts_20250127::LogEntry_const&)::_lambda()_1_>
              (&Send::warn_if_not_initialized.control_,scheduling_mode,fn);
  }
  sVar6 = (entry->stacktrace_)._M_string_length;
  if (sVar6 == 0) {
    pcVar5 = (entry->text_message_with_prefix_and_newline_and_nul_).ptr_;
    sVar6 = (entry->text_message_with_prefix_and_newline_and_nul_).len_ - 1;
  }
  else {
    pcVar5 = (entry->stacktrace_)._M_dataplus._M_p;
  }
  message._M_str = pcVar5;
  message._M_len = sVar6;
  WriteToStderr(message,entry->severity_);
  return;
}

Assistant:

void Send(const absl::LogEntry& entry) override {
    if (entry.log_severity() < absl::StderrThreshold() &&
        absl::log_internal::IsInitialized()) {
      return;
    }

    ABSL_CONST_INIT static absl::once_flag warn_if_not_initialized;
    absl::call_once(warn_if_not_initialized, []() {
      if (absl::log_internal::IsInitialized()) return;
      const char w[] =
          "WARNING: All log messages before absl::InitializeLog() is called"
          " are written to STDERR\n";
      absl::log_internal::WriteToStderr(w, absl::LogSeverity::kWarning);
    });

    if (!entry.stacktrace().empty()) {
      absl::log_internal::WriteToStderr(entry.stacktrace(),
                                        entry.log_severity());
    } else {
      // TODO(b/226937039): do this outside else condition once we avoid
      // ReprintFatalMessage
      absl::log_internal::WriteToStderr(
          entry.text_message_with_prefix_and_newline(), entry.log_severity());
    }
  }